

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O0

void __thiscall Clone_modelWithImportedItems_Test::TestBody(Clone_modelWithImportedItems_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  AssertHelper local_e8 [8];
  Message local_e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  shared_ptr local_b8 [32];
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  PrinterPtr printer;
  ModelPtr clonedModel;
  ModelPtr model;
  ParserPtr parser;
  allocator<char> local_31;
  string local_30 [8];
  string modelString;
  Clone_modelWithImportedItems_Test *this_local;
  
  modelString.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model\">\n  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"import1.cellml\">\n    <component component_ref=\"componentToFetch\" name=\"importedComponent1a\"/>\n    <units units_ref=\"unitsToFetch\" name=\"importedUnits1a\"/>\n    <component component_ref=\"componentToFetch\" name=\"importedComponent1b\"/>\n    <units units_ref=\"unitsToFetch\" name=\"importedUnits1b\"/>\n  </import>\n  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"import2.cellml\">\n    <component component_ref=\"componentToFetch\" name=\"importedComponent2\"/>\n    <units units_ref=\"unitsToFetch\" name=\"importedUnits2\"/>\n  </import>\n  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"import2.cellml\">\n    <component component_ref=\"componentToFetch\" name=\"importedComponent3\"/>\n    <units units_ref=\"unitsToFetch\" name=\"importedUnits4\"/>\n  </import>\n</model>"
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  this_00 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  libcellml::Parser::parseModel
            ((string *)
             &clonedModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &clonedModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Model::clone();
  libcellml::Printer::create();
  peVar2 = std::__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar.message_);
  libcellml::Printer::printModel_abi_cxx11_(local_b8,SUB81(peVar2,0));
  peVar2 = std::__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar.message_);
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&local_d8,SUB81(peVar2,0));
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((AssertionResult *)local_98,(EqHelper<false> *)"printer->printModel(model)",
             "printer->printModel(clonedModel)",(char *)local_b8,&local_d8,in_R9);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(local_e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              (local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x235,pcVar3);
    testing::internal::AssertHelper::operator=(local_e8,local_e0);
    testing::internal::AssertHelper::~AssertHelper(local_e8);
    testing::Message::~Message(local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  compareModel((shared_ptr *)
               &clonedModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               (shared_ptr *)
               &printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  std::shared_ptr<libcellml::Printer>::~shared_ptr
            ((shared_ptr<libcellml::Printer> *)&gtest_ar.message_);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &clonedModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(Clone, modelWithImportedItems)
{
    std::string modelString =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"import1.cellml\">\n"
        "    <component component_ref=\"componentToFetch\" name=\"importedComponent1a\"/>\n"
        "    <units units_ref=\"unitsToFetch\" name=\"importedUnits1a\"/>\n"
        "    <component component_ref=\"componentToFetch\" name=\"importedComponent1b\"/>\n"
        "    <units units_ref=\"unitsToFetch\" name=\"importedUnits1b\"/>\n"
        "  </import>\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"import2.cellml\">\n"
        "    <component component_ref=\"componentToFetch\" name=\"importedComponent2\"/>\n"
        "    <units units_ref=\"unitsToFetch\" name=\"importedUnits2\"/>\n"
        "  </import>\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"import2.cellml\">\n"
        "    <component component_ref=\"componentToFetch\" name=\"importedComponent3\"/>\n"
        "    <units units_ref=\"unitsToFetch\" name=\"importedUnits4\"/>\n"
        "  </import>\n"
        "</model>";
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelString);

    auto clonedModel = model->clone();

    auto printer = libcellml::Printer::create();
    EXPECT_EQ(printer->printModel(model), printer->printModel(clonedModel));
    compareModel(model, clonedModel);
}